

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmaes.cpp
# Opt level: O0

void __thiscall Cmaes::Cmaes(Cmaes *this)

{
  allocator local_31;
  string local_30 [32];
  Cmaes *local_10;
  Cmaes *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"CMAES",&local_31);
  Optimizer::Optimizer(&this->super_Optimizer,(string *)local_30,CMAES);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (this->super_Optimizer)._vptr_Optimizer = (_func_int **)&PTR_getName_abi_cxx11__002c6ce0;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->xmean);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->weights);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->arindex);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->arx);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->arfitness);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->arx_N_x_mu);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->xold);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->pc);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->ps);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->B);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->D);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->C);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->invsqrtC);
  return;
}

Assistant:

Cmaes::Cmaes(void) : Optimizer("CMAES", CMAES) 
{
}